

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalGenerator::CheckTargetsForMissingSources(cmGlobalGenerator *this)

{
  pointer ppcVar1;
  pointer ppcVar2;
  cmGeneratorTarget *this_00;
  cmake *this_01;
  pointer pbVar3;
  bool bVar4;
  bool bVar5;
  TargetType TVar6;
  pointer ppcVar7;
  char *val;
  ostream *poVar8;
  string *psVar9;
  iterator __begin4;
  pointer ppcVar10;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  undefined1 local_1f8 [16];
  string local_1e8;
  string local_1c8;
  ostringstream e;
  
  ppcVar7 = (this->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar1 = (this->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  bVar5 = false;
  do {
    if (ppcVar7 == ppcVar1) {
      return bVar5;
    }
    ppcVar2 = ((*ppcVar7)->GeneratorTargets).
              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppcVar10 = ((*ppcVar7)->GeneratorTargets).
                    super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppcVar10 != ppcVar2;
        ppcVar10 = ppcVar10 + 1) {
      this_00 = *ppcVar10;
      TVar6 = cmGeneratorTarget::GetType(this_00);
      if (((TVar6 != GLOBAL_TARGET) &&
          (TVar6 = cmGeneratorTarget::GetType(this_00), TVar6 != INTERFACE_LIBRARY)) &&
         (TVar6 = cmGeneratorTarget::GetType(this_00), TVar6 != UTILITY)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"ghs_integrity_app",(allocator<char> *)(local_1f8 + 0x10));
        val = cmGeneratorTarget::GetProperty(this_00,(string *)&e);
        bVar4 = cmSystemTools::IsOn(val);
        std::__cxx11::string::~string((string *)&e);
        if (!bVar4) {
          configs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          configs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          configs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmMakefile::GetConfigurations(&local_1c8,this_00->Makefile,&configs,true);
          std::__cxx11::string::~string((string *)&local_1c8);
          pbVar3 = configs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          srcs.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          srcs.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          srcs.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          psVar9 = configs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (configs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              configs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&e,"",(allocator<char> *)(local_1f8 + 0x10));
            cmGeneratorTarget::GetSourceFiles(this_00,&srcs,(string *)&e);
            std::__cxx11::string::~string((string *)&e);
LAB_0029e738:
            if (srcs.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                super__Vector_impl_data._M_start ==
                srcs.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                super__Vector_impl_data._M_finish) goto LAB_0029e741;
          }
          else {
            do {
              if (psVar9 == pbVar3) goto LAB_0029e738;
              cmGeneratorTarget::GetSourceFiles(this_00,&srcs,psVar9);
              psVar9 = psVar9 + 1;
            } while (srcs.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                     _M_impl.super__Vector_impl_data._M_start !=
                     srcs.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
LAB_0029e741:
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            poVar8 = std::operator<<((ostream *)&e,"No SOURCES given to target: ");
            psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
            std::operator<<(poVar8,(string *)psVar9);
            this_01 = this->CMakeInstance;
            std::__cxx11::stringbuf::str();
            cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1f8);
            cmake::IssueMessage(this_01,FATAL_ERROR,(string *)(local_1f8 + 0x10),
                                (cmListFileBacktrace *)local_1f8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8 + 8));
            std::__cxx11::string::~string((string *)(local_1f8 + 0x10));
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
            bVar5 = true;
          }
          std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
                    (&srcs.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&configs);
        }
      }
    }
    ppcVar7 = ppcVar7 + 1;
  } while( true );
}

Assistant:

std::string cmGlobalGenerator::GetLanguageOutputExtension(
  cmSourceFile const& source) const
{
  const std::string& lang = source.GetLanguage();
  if (!lang.empty()) {
    auto const it = this->LanguageToOutputExtension.find(lang);
    if (it != this->LanguageToOutputExtension.end()) {
      return it->second;
    }
  } else {
    // if no language is found then check to see if it is already an
    // output extension for some language.  In that case it should be ignored
    // and in this map, so it will not be compiled but will just be used.
    std::string const& ext = source.GetExtension();
    if (!ext.empty()) {
      if (this->OutputExtensions.count(ext)) {
        return ext;
      }
    }
  }
  return "";
}